

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O3

int mqtt_client_connect(MQTT_CLIENT_HANDLE handle,XIO_HANDLE xioHandle,
                       MQTT_CLIENT_OPTIONS *mqttOptions)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  char *in_RAX;
  LOGGER_LOG p_Var4;
  char *pcVar5;
  char *local_28;
  
  if (((xioHandle == (XIO_HANDLE)0x0) || (handle == (MQTT_CLIENT_HANDLE)0x0)) ||
     (mqttOptions == (MQTT_CLIENT_OPTIONS *)0x0)) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x450;
    }
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
              ,"mqtt_client_connect",0x44f,1,
              "mqtt_client_connect: NULL argument (handle = %p, mqttOptions = %p, xioHandle: %p)",
              handle,mqttOptions,xioHandle);
    return 0x450;
  }
  handle->xioHandle = xioHandle;
  handle->packetState = UNKNOWN_TYPE;
  handle->qosValue = mqttOptions->qualityOfServiceValue;
  uVar1 = mqttOptions->keepAliveInterval;
  handle->keepAliveInterval = uVar1;
  uVar2 = 0x50;
  if (uVar1 < 0xa2) {
    uVar2 = uVar1 >> 1;
  }
  handle->maxPingRespTime = uVar2;
  handle->timeSincePing = 0;
  local_28 = in_RAX;
  if (mqttOptions->clientId == (char *)0x0) {
LAB_00161c82:
    if (mqttOptions->willTopic != (char *)0x0) {
      local_28 = (char *)0x0;
      iVar3 = mallocAndStrcpy_s(&local_28,mqttOptions->willTopic);
      if (iVar3 != 0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar5 = "mallocAndStrcpy_s willTopic";
          iVar3 = 0x234;
          goto LAB_00161dfe;
        }
        goto LAB_00161e09;
      }
      pcVar5 = (handle->mqttOptions).willTopic;
      if (pcVar5 != (char *)0x0) {
        free(pcVar5);
      }
      (handle->mqttOptions).willTopic = local_28;
    }
    if (mqttOptions->willMessage != (char *)0x0) {
      local_28 = (char *)0x0;
      iVar3 = mallocAndStrcpy_s(&local_28,mqttOptions->willMessage);
      if (iVar3 != 0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar5 = "mallocAndStrcpy_s willMessage";
          iVar3 = 0x244;
          goto LAB_00161dfe;
        }
        goto LAB_00161e09;
      }
      pcVar5 = (handle->mqttOptions).willMessage;
      if (pcVar5 != (char *)0x0) {
        free(pcVar5);
      }
      (handle->mqttOptions).willMessage = local_28;
    }
    if (mqttOptions->username != (char *)0x0) {
      local_28 = (char *)0x0;
      iVar3 = mallocAndStrcpy_s(&local_28,mqttOptions->username);
      if (iVar3 != 0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar5 = "mallocAndStrcpy_s username";
          iVar3 = 0x255;
          goto LAB_00161dfe;
        }
        goto LAB_00161e09;
      }
      pcVar5 = (handle->mqttOptions).username;
      if (pcVar5 != (char *)0x0) {
        free(pcVar5);
      }
      (handle->mqttOptions).username = local_28;
    }
    if (mqttOptions->password != (char *)0x0) {
      local_28 = (char *)0x0;
      iVar3 = mallocAndStrcpy_s(&local_28,mqttOptions->password);
      if (iVar3 != 0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar5 = "mallocAndStrcpy_s password";
          iVar3 = 0x266;
          goto LAB_00161dfe;
        }
        goto LAB_00161e09;
      }
      pcVar5 = (handle->mqttOptions).password;
      if (pcVar5 != (char *)0x0) {
        free(pcVar5);
      }
      (handle->mqttOptions).password = local_28;
    }
    (handle->mqttOptions).keepAliveInterval = mqttOptions->keepAliveInterval;
    (handle->mqttOptions).messageRetain = mqttOptions->messageRetain;
    (handle->mqttOptions).useCleanSession = mqttOptions->useCleanSession;
    (handle->mqttOptions).qualityOfServiceValue = mqttOptions->qualityOfServiceValue;
    iVar3 = xio_open(xioHandle,onOpenComplete,handle,onBytesReceived,handle,onIoError,handle);
    if (iVar3 == 0) {
      iVar3 = 0;
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                  ,"mqtt_client_connect",0x464,1,"Error: io_open failed");
      }
      handle->xioHandle = (XIO_HANDLE)0x0;
      clear_mqtt_options(handle);
      iVar3 = 0x465;
    }
  }
  else {
    iVar3 = mallocAndStrcpy_s(&local_28,mqttOptions->clientId);
    if (iVar3 == 0) {
      pcVar5 = (handle->mqttOptions).clientId;
      if (pcVar5 != (char *)0x0) {
        free(pcVar5);
      }
      (handle->mqttOptions).clientId = local_28;
      goto LAB_00161c82;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar5 = "mallocAndStrcpy_s clientId";
      iVar3 = 0x223;
LAB_00161dfe:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                ,"cloneMqttOptions",iVar3,1,pcVar5);
    }
LAB_00161e09:
    clear_mqtt_options(handle);
    p_Var4 = xlogging_get_log_function();
    iVar3 = 0x45e;
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                ,"mqtt_client_connect",0x45d,1,"Error: Clone Mqtt Options failed");
    }
  }
  return iVar3;
}

Assistant:

int mqtt_client_connect(MQTT_CLIENT_HANDLE handle, XIO_HANDLE xioHandle, MQTT_CLIENT_OPTIONS* mqttOptions)
{
    int result;
    /*SRS_MQTT_CLIENT_07_006: [If any of the parameters handle, ioHandle, or mqttOptions are NULL then mqtt_client_connect shall return a non-zero value.]*/
    if (handle == NULL || mqttOptions == NULL || xioHandle == NULL)
    {
        LogError("mqtt_client_connect: NULL argument (handle = %p, mqttOptions = %p, xioHandle: %p)", handle, mqttOptions, xioHandle);
        result = MU_FAILURE;
    }
    else
    {
        MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)handle;
        mqtt_client->xioHandle = xioHandle;
        mqtt_client->packetState = UNKNOWN_TYPE;
        mqtt_client->qosValue = mqttOptions->qualityOfServiceValue;
        mqtt_client->keepAliveInterval = mqttOptions->keepAliveInterval;
        mqtt_client->maxPingRespTime = (DEFAULT_MAX_PING_RESPONSE_TIME < mqttOptions->keepAliveInterval/2) ? DEFAULT_MAX_PING_RESPONSE_TIME : mqttOptions->keepAliveInterval/2;
        mqtt_client->timeSincePing = 0;
        if (cloneMqttOptions(mqtt_client, mqttOptions) != 0)
        {
            LogError("Error: Clone Mqtt Options failed");
            result = MU_FAILURE;
        }
        /*Codes_SRS_MQTT_CLIENT_07_008: [mqtt_client_connect shall open the XIO_HANDLE by calling into the xio_open interface.]*/
        else if (xio_open(xioHandle, onOpenComplete, mqtt_client, onBytesReceived, mqtt_client, onIoError, mqtt_client) != 0)
        {
            /*Codes_SRS_MQTT_CLIENT_07_007: [If any failure is encountered then mqtt_client_connect shall return a non-zero value.]*/
            LogError("Error: io_open failed");
            result = MU_FAILURE;
            mqtt_client->xioHandle = NULL;
            // Remove cloned options
            clear_mqtt_options(mqtt_client);
        }
        else
        {
            result = 0;
        }
    }
    return result;
}